

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O0

void do_ltrack(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  MYSQL *pMVar3;
  undefined8 uVar4;
  string query;
  int i;
  int show;
  int type;
  char buf [4608];
  char arg2 [4608];
  char arg1 [4608];
  BUFFER *buffer;
  MYSQL_RES *res_set;
  MYSQL_ROW row;
  MYSQL *conn;
  CHAR_DATA *in_stack_ffffffffffffc788;
  char *in_stack_ffffffffffffc790;
  CHAR_DATA *in_stack_ffffffffffffc798;
  char *in_stack_ffffffffffffc7a0;
  char *string;
  BUFFER *in_stack_ffffffffffffc7a8;
  CHAR_DATA *local_3850;
  char *local_3840;
  char *local_3838;
  char *local_37d8;
  char *local_37b8;
  char *local_37b0;
  char *local_37a8 [2];
  string local_3798 [36];
  int local_3774;
  int local_3770;
  uint local_376c;
  char local_3768 [344];
  format_args in_stack_ffffffffffffc9f0;
  string_view in_stack_ffffffffffffca00;
  char local_2568 [4608];
  v9 local_1368 [4608];
  BUFFER *local_168;
  long local_160;
  undefined8 *local_158;
  MYSQL *local_150;
  char *local_148;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char[4608],_char[4608],_const_char_*,_const_char_*>
  local_138;
  undefined8 local_e0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char[4608],_char[4608],_const_char_*,_const_char_*>
  *local_d8;
  char *local_d0;
  size_t local_c8;
  char **local_c0;
  char (*local_b8) [4608];
  v9 *local_b0;
  v9 *local_a8;
  v9 *local_a0;
  char *local_98;
  size_t sStack_90;
  string *local_88;
  char *local_80;
  char **local_78;
  char *local_70;
  char **local_68;
  char **local_60;
  char *local_58;
  size_t sStack_50;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char[4608],_char[4608],_const_char_*,_const_char_*>
  *local_40;
  undefined8 *local_38;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char[4608],_char[4608],_const_char_*,_const_char_*>
  *local_30;
  undefined8 local_28;
  undefined8 *local_20;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char[4608],_char[4608],_const_char_*,_const_char_*>
  *local_18;
  char *local_10;
  
  local_376c = 0xffffffff;
  local_3770 = -1;
  local_3774 = 0;
  local_148 = one_argument(in_stack_ffffffffffffc790,(char *)in_stack_ffffffffffffc788);
  local_148 = one_argument(in_stack_ffffffffffffc790,(char *)in_stack_ffffffffffffc788);
  if (local_1368[0] == (v9)0x0) {
    send_to_char(in_stack_ffffffffffffc7a0,in_stack_ffffffffffffc798);
    return;
  }
  local_3850 = in_stack_ffffffffffffc788;
  if (local_2568[0] != '\0') {
    bVar1 = str_cmp(local_2568,"new");
    if (bVar1) {
      bVar1 = str_cmp(local_2568,"in");
      if (bVar1) {
        bVar1 = str_cmp(local_2568,"out");
        local_3850 = in_stack_ffffffffffffc788;
        if (!bVar1) {
          local_376c = 2;
        }
      }
      else {
        local_376c = 1;
        local_3850 = in_stack_ffffffffffffc788;
      }
    }
    else {
      local_376c = 0;
      local_3850 = in_stack_ffffffffffffc788;
    }
    if ((*local_148 != '\0') && (bVar1 = is_number((char *)local_3850), bVar1)) {
      local_3770 = atoi(local_148);
    }
  }
  local_168 = new_buf();
  sprintf(local_3768,"%d",(ulong)local_376c);
  local_78 = local_37a8;
  local_80 = 
  "SELECT * FROM logins WHERE (name RLIKE \'{}\' OR site RLIKE \'{}\' OR time RLIKE \'{}\') {}{} ORDER BY ctime DESC"
  ;
  local_70 = 
  "SELECT * FROM logins WHERE (name RLIKE \'{}\' OR site RLIKE \'{}\' OR time RLIKE \'{}\') {}{} ORDER BY ctime DESC"
  ;
  local_37a8[0] =
       "SELECT * FROM logins WHERE (name RLIKE \'{}\' OR site RLIKE \'{}\' OR time RLIKE \'{}\') {}{} ORDER BY ctime DESC"
  ;
  local_68 = local_78;
  local_c8 = std::char_traits<char>::length((char_type *)0x65e555);
  local_10 = local_80;
  local_37b0 = "";
  if (-1 < (int)local_376c) {
    local_37b0 = "AND type=";
  }
  if ((int)local_376c < 0) {
    local_37d8 = "";
  }
  else {
    local_37d8 = local_3768;
  }
  local_37b8 = local_37d8;
  local_88 = local_3798;
  local_98 = local_37a8[0];
  local_b0 = local_1368;
  local_b8 = (char (*) [4608])&local_37b0;
  local_c0 = &local_37b8;
  local_60 = &local_98;
  local_d0 = local_37a8[0];
  local_a8 = local_b0;
  local_a0 = local_b0;
  sStack_90 = local_c8;
  local_58 = local_d0;
  sStack_50 = local_c8;
  fmt::v9::
  make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char(&)[4608],char(&)[4608],char(&)[4608],char_const*&,char_const*&>
            (&local_138,local_b0,(char (*) [4608])local_b0,(char (*) [4608])local_b0,local_b8,
             local_c0,(char **)local_3850);
  local_38 = &local_e0;
  local_28 = 0xccccc;
  local_e0 = 0xccccc;
  local_40 = &local_138;
  local_30 = &local_138;
  local_20 = local_38;
  local_18 = &local_138;
  local_d8 = &local_138;
  fmt::v9::vformat_abi_cxx11_(in_stack_ffffffffffffca00,in_stack_ffffffffffffc9f0);
  pMVar3 = open_conn();
  local_150 = pMVar3;
  uVar4 = std::__cxx11::string::c_str();
  mysql_query(pMVar3,uVar4);
  local_160 = mysql_store_result(local_150);
  if ((local_160 == 0) && (iVar2 = mysql_field_count(local_150), iVar2 != 0)) {
    send_to_char(in_stack_ffffffffffffc7a0,in_stack_ffffffffffffc798);
  }
  else if (local_160 != 0) {
    while ((local_158 = (undefined8 *)mysql_fetch_row(local_160), local_158 != (undefined8 *)0x0 &&
           (((local_3774 = local_3774 + 1, local_3770 == -1 || (local_3774 <= local_3770)) &&
            (local_3774 < 0x12d))))) {
      sprintf(local_3768,"%s",local_158[7]);
      local_376c = atoi(local_3768);
      if (local_376c == 0) {
        local_3838 = "new";
      }
      else {
        if (local_376c == 1) {
          local_3840 = "in";
        }
        else {
          local_3840 = "?";
          if (local_376c == 2) {
            local_3840 = "out";
          }
        }
        local_3838 = local_3840;
      }
      if (local_376c == 2) {
        local_3850 = (CHAR_DATA *)local_158[4];
      }
      else {
        local_3850 = (CHAR_DATA *)0x7e100f;
      }
      in_stack_ffffffffffffc790 = "";
      if (local_376c == 2) {
        in_stack_ffffffffffffc790 = " played, ";
      }
      string = (char *)local_158[6];
      sprintf(local_3768,"%s: %s@%s logged %s. [%s%s%s (%s) obj]\n\r",local_158[2],*local_158,
              local_158[1],local_3838,local_3850,in_stack_ffffffffffffc790,local_158[5]);
      add_buf(in_stack_ffffffffffffc7a8,string);
    }
    mysql_free_result(local_160);
    buf_string(local_168);
    page_to_char(in_stack_ffffffffffffc790,local_3850);
    free_buf((BUFFER *)0x65ea94);
    mysql_close(local_150);
    goto LAB_0065eae4;
  }
  send_to_char(in_stack_ffffffffffffc7a0,in_stack_ffffffffffffc798);
  mysql_close(local_150);
LAB_0065eae4:
  std::__cxx11::string::~string(local_3798);
  return;
}

Assistant:

void do_ltrack(CHAR_DATA *ch, char *argument)
{
	MYSQL *conn;
	MYSQL_ROW row;
	MYSQL_RES *res_set;
	BUFFER *buffer;
	char arg1[MSL], arg2[MSL], buf[MSL];
	int type = -1, show = -1, i = 0;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	if (arg1[0] == '\0')
	{
		send_to_char("Syntax: ltrack <name, date, site> <all/new/in/out?> <#display?>\n\r", ch);
		return;
	}

	if (arg2[0] != '\0')
	{
		if (!str_cmp(arg2, "new"))
		{
			type = 0;
		}
		else if (!str_cmp(arg2, "in"))
		{
			type = 1;
		}
		else if (!str_cmp(arg2, "out"))
		{
			type = 2;
		}

		if (argument[0] != '\0' && is_number(argument))
		{
			show = atoi(argument);
		}
	}

	buffer = new_buf();
	sprintf(buf, "%d", type);
	auto query = fmt::format("SELECT * FROM logins WHERE (name RLIKE '{}' OR site RLIKE '{}' OR time RLIKE '{}') {}{} ORDER BY ctime DESC",
		arg1,
		arg1,
		arg1,
		type > -1 ? "AND type=" : "",
		type > -1 ? buf : "");

	conn = open_conn();
	mysql_query(conn, query.c_str());
	res_set = mysql_store_result(conn);

	if (res_set == nullptr && mysql_field_count(conn) > 0)
	{
		send_to_char("Error accessing results.\n\r", ch);
	}
	else if (res_set)
	{
		while ((row = mysql_fetch_row(res_set)) != nullptr)
		{
			i++;

			if ((show != -1 && i > show) || i > 300)
				break;

			sprintf(buf, "%s", row[7]);
			type = atoi(buf);

			sprintf(buf, "%s: %s@%s logged %s. [%s%s%s (%s) obj]\n\r",
				row[2],
				row[0],
				row[1],
				type == 0 ? "new" : type == 1 ? "in" : type == 2 ? "out" : "?",
				type == 2 ? row[4] : "",
				type == 2 ? " played, " : "",
				row[5],
				row[6]);
			add_buf(buffer, buf);
		}

		mysql_free_result(res_set);
		page_to_char(buf_string(buffer), ch);
		free_buf(buffer);
		mysql_close(conn);
		return;
	}

	send_to_char("No matching results were found.\n\r", ch);
	mysql_close(conn);
	return;
}